

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinDeserializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
     ::deserialize_elems_noinsert<binlog::Range>
               (undefined8 *param_1,undefined8 param_2,Range *param_3)

{
  char *elem;
  char *t;
  long lVar1;
  
  t = (char *)*param_1;
  for (lVar1 = param_1[1]; lVar1 != 0; lVar1 = lVar1 + -1) {
    TrivialDeserializer<char>::deserialize<binlog::Range>(t,param_3);
    t = t + 1;
  }
  return;
}

Assistant:

static void deserialize_elems_noinsert(
    std::false_type /* no batch deserialization */,
    std::false_type /* not a proxy sequence */,
    Sequence& s, std::uint32_t /*size*/, InputStream& istream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::deserialize(elem, istream);
    }
  }